

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O3

char * xmemmem(char *hay,size_t hz_,char *ndl,size_t nz)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *__s1;
  byte bVar9;
  
  pbVar4 = (byte *)memchr(hay,(int)*ndl,hz_);
  if (pbVar4 != (byte *)0x0) {
    pbVar7 = (byte *)(hay + hz_);
    __s1 = pbVar4 + 1;
    if ((long)nz < 2 || pbVar7 <= __s1) {
      if ((long)nz < 2) {
        return (char *)pbVar4;
      }
    }
    else {
      bVar9 = *pbVar4;
      bVar1 = true;
      pcVar2 = ndl + 2;
      pbVar8 = __s1;
      bVar5 = bVar9;
      do {
        pcVar6 = pcVar2;
        bVar5 = bVar5 ^ *pbVar8;
        bVar9 = bVar9 ^ pcVar6[-1];
        if (*pbVar8 != pcVar6[-1]) {
          bVar1 = false;
        }
        pbVar8 = pbVar8 + 1;
      } while ((pbVar8 < pbVar7) && (pcVar2 = pcVar6 + 1, pcVar6 < ndl + nz));
      if (ndl + nz <= pcVar6) {
        if (bVar1) {
          return (char *)pbVar4;
        }
        if (pbVar8 < pbVar7) {
          while( true ) {
            pbVar4 = pbVar4 + 1;
            bVar5 = *pbVar8 ^ __s1[-1] ^ bVar5;
            if ((bVar5 == bVar9) && (iVar3 = bcmp(__s1,ndl,nz - 1), iVar3 == 0)) break;
            pbVar8 = pbVar8 + 1;
            __s1 = __s1 + 1;
            if (pbVar7 <= pbVar8) {
              return (char *)0x0;
            }
          }
          return (char *)pbVar4;
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char*
xmemmem(const char *hay, const size_t hz_, const char *ndl, const size_t nz)
{
	const char *const eoh = hay + hz_;
	const char *const eon = ndl + nz;
	const char *hp;
	const char *np;
	const char *cand;
	unsigned int hsum;
	unsigned int nsum;
	unsigned int eqp;

	/* trivial checks first
         * a 0-sized needle is defined to be found anywhere in haystack
         * then run strchr() to find a candidate in HAYSTACK (i.e. a portion
         * that happens to begin with *NEEDLE) */
	if (nz == 0UL) {
		return deconst(hay);
	} else if ((hay = memchr(hay, *ndl, hz_)) == NULL) {
		/* trivial */
		return NULL;
	}

	/* First characters of haystack and needle are the same now. Both are
	 * guaranteed to be at least one character long.  Now computes the sum
	 * of characters values of needle together with the sum of the first
	 * needle_len characters of haystack. */
	for (hp = hay + 1U, np = ndl + 1U, hsum = *hay, nsum = *hay, eqp = 1U;
	     hp < eoh && np < eon;
	     hsum ^= *hp, nsum ^= *np, eqp &= *hp == *np, hp++, np++);

	/* HP now references the (NZ + 1)-th character. */
	if (np < eon) {
		/* haystack is smaller than needle, :O */
		return NULL;
	} else if (eqp) {
		/* found a match */
		return deconst(hay);
	}

	/* now loop through the rest of haystack,
	 * updating the sum iteratively */
	for (cand = hay; hp < eoh; hp++) {
		hsum ^= *cand++;
		hsum ^= *hp;

		/* Since the sum of the characters is already known to be
		 * equal at that point, it is enough to check just NZ - 1
		 * characters for equality,
		 * also CAND is by design < HP, so no need for range checks */
		if (hsum == nsum && memcmp(cand, ndl, nz - 1U) == 0) {
			return deconst(cand);
		}
	}
	return NULL;
}